

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::stats_alert::message_abi_cxx11_(string *__return_storage_ptr__,stats_alert *this)

{
  size_t sVar1;
  string local_118;
  char msg [200];
  
  torrent_alert::message_abi_cxx11_(&local_118,&this->super_torrent_alert);
  snprintf(msg,200,"%s: [%d] %d %d %d %d %d %d %d %d %d %d",local_118._M_dataplus._M_p,
           (ulong)(uint)this->interval,(ulong)(uint)(this->transferred)._M_elems[0],
           (ulong)(uint)(this->transferred)._M_elems[1],(ulong)(uint)(this->transferred)._M_elems[2]
           ,(ulong)(uint)(this->transferred)._M_elems[3],
           (ulong)(uint)(this->transferred)._M_elems[4],(ulong)(uint)(this->transferred)._M_elems[5]
           ,(ulong)(uint)(this->transferred)._M_elems[6],
           (ulong)(uint)(this->transferred)._M_elems[7],(ulong)(uint)(this->transferred)._M_elems[8]
           ,(ulong)(uint)(this->transferred)._M_elems[9]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(msg);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,msg,msg + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stats_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), "%s: [%d] %d %d %d %d %d %d"
#if TORRENT_ABI_VERSION == 1
			" %d %d %d %d"
#endif
			, torrent_alert::message().c_str()
			, interval
			, transferred[0]
			, transferred[1]
			, transferred[2]
			, transferred[3]
			, transferred[4]
			, transferred[5]
#if TORRENT_ABI_VERSION == 1
			, transferred[6]
			, transferred[7]
			, transferred[8]
			, transferred[9]
#endif
			);
		return msg;
	}